

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.cc
# Opt level: O3

string_view absl::lts_20250127::FindLongestCommonPrefix(string_view a,string_view b)

{
  short *psVar1;
  short *psVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  char *pcVar8;
  ulong uVar9;
  string_view sVar10;
  string_view sVar11;
  string_view sVar12;
  
  pcVar6 = b._M_str;
  pcVar8 = a._M_str;
  uVar5 = a._M_len;
  if (b._M_len < a._M_len) {
    uVar5 = b._M_len;
  }
  uVar7 = 0;
  if (uVar5 < 8) {
    while (uVar9 = uVar7 + 2, uVar9 <= uVar5) {
      psVar1 = (short *)(pcVar8 + uVar7);
      psVar2 = (short *)(pcVar6 + uVar7);
      uVar7 = uVar9;
      if (*psVar1 != *psVar2) {
        sVar12._M_len = (((char)*psVar2 == (char)*psVar1) + uVar9) - 2;
        sVar12._M_str = pcVar8;
        return sVar12;
      }
    }
    if (uVar5 != uVar7) {
      uVar5 = (ulong)(pcVar8[uVar7] == pcVar6[uVar7]);
LAB_0014200b:
      sVar10._M_len = uVar5 + uVar7;
      sVar10._M_str = pcVar8;
      return sVar10;
    }
  }
  else {
    do {
      if (*(ulong *)(pcVar8 + uVar7) != *(ulong *)(pcVar6 + uVar7)) {
        uVar5 = *(ulong *)(pcVar6 + uVar7) ^ *(ulong *)(pcVar8 + uVar7);
        if (uVar5 == 0) {
          uVar4 = 0x40;
        }
        else {
          lVar3 = 0;
          if (uVar5 != 0) {
            for (; (uVar5 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
            }
          }
          uVar4 = (uint)lVar3;
        }
        uVar5 = (ulong)(uVar4 >> 3);
        goto LAB_0014200b;
      }
      uVar9 = uVar7 + 0x10;
      uVar7 = uVar7 + 8;
    } while (uVar9 < uVar5);
    if (*(ulong *)(pcVar8 + (uVar5 - 8)) != *(ulong *)(pcVar6 + (uVar5 - 8))) {
      uVar7 = *(ulong *)(pcVar6 + (uVar5 - 8)) ^ *(ulong *)(pcVar8 + (uVar5 - 8));
      if (uVar7 == 0) {
        uVar4 = 0x40;
      }
      else {
        lVar3 = 0;
        if (uVar7 != 0) {
          for (; (uVar7 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
          }
        }
        uVar4 = (uint)lVar3;
      }
      uVar5 = (uVar5 - 8) + (ulong)(uVar4 >> 3);
    }
  }
  sVar11._M_str = pcVar8;
  sVar11._M_len = uVar5;
  return sVar11;
}

Assistant:

absl::string_view FindLongestCommonPrefix(absl::string_view a,
                                          absl::string_view b) {
  const absl::string_view::size_type limit = std::min(a.size(), b.size());
  const char* const pa = a.data();
  const char* const pb = b.data();
  absl::string_view::size_type count = (unsigned) 0;

  if (ABSL_PREDICT_FALSE(limit < 8)) {
    while (ABSL_PREDICT_TRUE(count + 2 <= limit)) {
      uint16_t xor_bytes = absl::little_endian::Load16(pa + count) ^
                           absl::little_endian::Load16(pb + count);
      if (ABSL_PREDICT_FALSE(xor_bytes != 0)) {
        if (ABSL_PREDICT_TRUE((xor_bytes & 0xff) == 0)) ++count;
        return absl::string_view(pa, count);
      }
      count += 2;
    }
    if (ABSL_PREDICT_TRUE(count != limit)) {
      if (ABSL_PREDICT_TRUE(pa[count] == pb[count])) ++count;
    }
    return absl::string_view(pa, count);
  }

  do {
    uint64_t xor_bytes = absl::little_endian::Load64(pa + count) ^
                         absl::little_endian::Load64(pb + count);
    if (ABSL_PREDICT_FALSE(xor_bytes != 0)) {
      count += static_cast<uint64_t>(absl::countr_zero(xor_bytes) >> 3);
      return absl::string_view(pa, count);
    }
    count += 8;
  } while (ABSL_PREDICT_TRUE(count + 8 < limit));

  count = limit - 8;
  uint64_t xor_bytes = absl::little_endian::Load64(pa + count) ^
                       absl::little_endian::Load64(pb + count);
  if (ABSL_PREDICT_TRUE(xor_bytes != 0)) {
    count += static_cast<uint64_t>(absl::countr_zero(xor_bytes) >> 3);
    return absl::string_view(pa, count);
  }
  return absl::string_view(pa, limit);
}